

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Gecko::Graph::vcycle(Graph *this,uint n,uint work)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Graph *pGVar5;
  uint *puVar6;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_stack_00000008;
  bool in_stack_0000000f;
  Graph *in_stack_00000010;
  uint w;
  Graph *graph;
  Graph *in_stack_00000108;
  Graph *in_stack_00000110;
  uint in_stack_000001fc;
  Graph *in_stack_00000200;
  Graph *in_stack_000002f0;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar7;
  uint local_2c;
  uint local_28;
  
  uVar7 = in_ESI;
  uVar1 = nodes((Graph *)0x12a218);
  uVar3 = uVar7;
  if (in_ESI < uVar1) {
    uVar1 = nodes((Graph *)0x12a230);
    uVar2 = edges((Graph *)0x12a23e);
    uVar3 = uVar7;
    if (((uVar1 < uVar2) && (*(int *)(in_RDI + 0x88) != 0)) &&
       (uVar4 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))(), uVar3 = uVar7, (uVar4 & 1) == 0)) {
      pGVar5 = coarsen(in_stack_000002f0);
      uVar3 = uVar7;
      edges((Graph *)0x12a2a8);
      vcycle((Graph *)CONCAT44(uVar3,in_EDX),(uint)((ulong)pGVar5 >> 0x20),(uint)pGVar5);
      refine(in_stack_00000110,in_stack_00000108);
      if (pGVar5 != (Graph *)0x0) {
        ~Graph((Graph *)CONCAT44(uVar7,in_stack_ffffffffffffffb0));
        operator_delete(pGVar5);
      }
      goto LAB_0012a31c;
    }
  }
  place((Graph *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (bool)in_stack_ffffffffffffff9f);
LAB_0012a31c:
  uVar1 = edges((Graph *)0x12a326);
  if (uVar1 != 0) {
    relax(in_stack_00000010,in_stack_0000000f,in_stack_00000008);
    relax(in_stack_00000010,in_stack_0000000f,in_stack_00000008);
    for (local_28 = edges((Graph *)0x12a35b); local_28 * (uVar3 + 1) < in_EDX;
        local_28 = uVar3 * local_28) {
      uVar3 = uVar3 + 1;
    }
    local_2c = 0x10;
    puVar6 = std::min<unsigned_int>((uint *)&stack0xfffffffffffffff4,&local_2c);
    if (*puVar6 != 0) {
      optimize(in_stack_00000200,in_stack_000001fc);
    }
  }
  return;
}

Assistant:

void
Graph::vcycle(uint n, uint work)
{
  if (n < nodes() && nodes() < edges() && level && !progress->quit()) {
    Graph* graph = coarsen();
    graph->vcycle(n, work + edges());
    refine(graph);
    delete graph;
  }
  else
    place();
  if (edges()) {
    relax(true, GECKO_CR_SWEEPS);
    relax(false, GECKO_GS_SWEEPS);
    for (uint w = edges(); w * (n + 1) < work; w *= ++n);
    n = std::min(n, uint(GECKO_WINDOW_MAX));
    if (n)
      optimize(n);
  }
}